

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O0

void __thiscall wasm::OptimizationOptions::parse(OptimizationOptions *this,int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  OptimizationOptions *this_local;
  
  ::wasm::Options::parse((int)this + 8,(char **)(ulong)(uint)argc);
  if (((this->allowStackIR & 1U) != 0) &&
     ((1 < (this->super_ToolOptions).passOptions.optimizeLevel ||
      (0 < (this->super_ToolOptions).passOptions.shrinkLevel)))) {
    (this->super_ToolOptions).passOptions.generateStackIR = true;
    (this->super_ToolOptions).passOptions.optimizeStackIR = true;
  }
  return;
}

Assistant:

void parse(int argc, const char* argv[]) {
    ToolOptions::parse(argc, argv);

    // After parsing the arguments, update defaults based on the optimize/shrink
    // levels.
    if (allowStackIR &&
        (passOptions.optimizeLevel >= 2 || passOptions.shrinkLevel >= 1)) {
      passOptions.generateStackIR = true;
      passOptions.optimizeStackIR = true;
    }
  }